

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

double __thiscall r_exec::Group::update_vis_thr(Group *this)

{
  uint64_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  float fVar3;
  undefined1 auVar4 [16];
  Atom local_1c [4];
  double local_18;
  double new_vis_thr;
  Group *this_local;
  
  new_vis_thr = (double)this;
  if (this->vis_thr_changes != 0) {
    fVar3 = get_vis_thr(this);
    uVar1 = this->vis_thr_changes;
    auVar4._8_4_ = (int)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    local_18 = (double)fVar3 +
               this->acc_vis_thr /
               ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    if (0.0 <= local_18) {
      if (1.0 < local_18) {
        local_18 = 1.0;
      }
    }
    else {
      local_18 = 0.0;
    }
    r_code::Atom::Float((float)local_18);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,4);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_1c);
    r_code::Atom::~Atom(local_1c);
  }
  this->acc_vis_thr = 0.0;
  this->vis_thr_changes = 0;
  fVar3 = get_vis_thr(this);
  return (double)fVar3;
}

Assistant:

double Group::update_vis_thr()
{
    if (vis_thr_changes) {
        double new_vis_thr = get_vis_thr() + acc_vis_thr / vis_thr_changes;

        if (new_vis_thr < 0) {
            new_vis_thr = 0;
        } else if (new_vis_thr > 1) {
            new_vis_thr = 1;
        }

        code(GRP_VIS_THR) = r_code::Atom::Float(new_vis_thr);
    }

    acc_vis_thr = 0;
    vis_thr_changes = 0;
    return get_vis_thr();
}